

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O3

UBool __thiscall
icu_63::CollationWeights::allocWeights
          (CollationWeights *this,uint32_t lowerLimit,uint32_t upperLimit,int32_t n)

{
  UBool UVar1;
  int32_t minLength;
  long lVar2;
  WeightRange *range;
  
  UVar1 = getWeightRanges(this,lowerLimit,upperLimit);
  if (UVar1 == '\0') {
LAB_0024bbc5:
    UVar1 = '\0';
  }
  else {
    minLength = this->ranges[0].length;
    UVar1 = allocWeightsInShortRanges(this,n,minLength);
    if (UVar1 == '\0') {
      do {
        if (minLength == 4) goto LAB_0024bbc5;
        UVar1 = allocWeightsInMinLengthRanges(this,n,minLength);
        if (UVar1 != '\0') break;
        if (0 < this->rangeCount) {
          lVar2 = 0;
          range = this->ranges;
          do {
            if (range->length != minLength) break;
            lengthenRange(this,range);
            lVar2 = lVar2 + 1;
            range = range + 1;
          } while (lVar2 < this->rangeCount);
        }
        minLength = this->ranges[0].length;
        UVar1 = allocWeightsInShortRanges(this,n,minLength);
      } while (UVar1 == '\0');
    }
    this->rangeIndex = 0;
    UVar1 = '\x01';
  }
  return UVar1;
}

Assistant:

UBool
CollationWeights::allocWeights(uint32_t lowerLimit, uint32_t upperLimit, int32_t n) {
#ifdef UCOL_DEBUG
    puts("");
#endif

    if(!getWeightRanges(lowerLimit, upperLimit)) {
#ifdef UCOL_DEBUG
        printf("error: unable to get Weight ranges\n");
#endif
        return FALSE;
    }

    /* try until we find suitably large ranges */
    for(;;) {
        /* get the smallest number of bytes in a range */
        int32_t minLength=ranges[0].length;

        if(allocWeightsInShortRanges(n, minLength)) { break; }

        if(minLength == 4) {
#ifdef UCOL_DEBUG
            printf("error: the maximum number of %ld weights is insufficient for n=%ld\n",
                   minLengthCount, n);
#endif
            return FALSE;
        }

        if(allocWeightsInMinLengthRanges(n, minLength)) { break; }

        /* no good match, lengthen all minLength ranges and iterate */
#ifdef UCOL_DEBUG
        printf("lengthen the short ranges from %ld bytes to %ld and iterate\n", minLength, minLength+1);
#endif
        for(int32_t i=0; i<rangeCount && ranges[i].length==minLength; ++i) {
            lengthenRange(ranges[i]);
        }
    }

#ifdef UCOL_DEBUG
    puts("final ranges:");
    for(int32_t i=0; i<rangeCount; ++i) {
        printf("ranges[%ld] .start=0x%08lx .end=0x%08lx .length=%ld .count=%ld\n",
               i, ranges[i].start, ranges[i].end, ranges[i].length, ranges[i].count);
    }
#endif

    rangeIndex = 0;
    return TRUE;
}